

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

void __thiscall re2::SparseArray<int>::SparseArray(SparseArray<int> *this,int max_size)

{
  int in_ESI;
  SparseArray<int> *in_RDI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  in_RDI->size_ = 0;
  PODArray<int>::PODArray
            ((PODArray<int> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  PODArray<re2::SparseArray<int>::IndexValue>::PODArray
            ((PODArray<re2::SparseArray<int>::IndexValue> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  MaybeInitializeMemory(in_RDI,in_RDI->size_,in_ESI);
  DebugCheckInvariants(in_RDI);
  return;
}

Assistant:

SparseArray<Value>::SparseArray(int max_size) :
    sparse_(max_size), dense_(max_size) {
  MaybeInitializeMemory(size_, max_size);
  DebugCheckInvariants();
}